

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

statement_ptr __thiscall
mjs::parser::
make_statement<mjs::block_statement,std::vector<std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>,std::allocator<std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>>>,bool&>
          (parser *this,
          vector<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
          *args,bool *args_1)

{
  pointer puVar1;
  element_type *this_00;
  statement *psVar2;
  undefined8 in_RCX;
  source_extend local_40;
  
  puVar1 = args[4].
           super__Vector_base<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  if (puVar1 != (pointer)0x0) {
    this_00 = (element_type *)operator_new(0x40);
    psVar2 = (puVar1->_M_t).
             super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t.
             super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
             super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl;
    local_40.file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)(psVar2->super_syntax_node)._vptr_syntax_node;
    local_40.file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
            &(psVar2->super_syntax_node).extend_.file.
             super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>;
    if (local_40.file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_40.file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_40.file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
        psVar2 = (puVar1->_M_t).
                 super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t.
                 super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
                 super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl;
      }
      else {
        (local_40.file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_40.file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    local_40.start =
         *(uint32_t *)
          &puVar1[3]._M_t.
           super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t.
           super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
           super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl;
    local_40.end = *(uint32_t *)((long)&psVar2[3].super_syntax_node._vptr_syntax_node + 4);
    block_statement::block_statement
              ((block_statement *)this_00,&local_40,(statement_list *)args_1,*(bool *)in_RCX);
    (this->source_).super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         this_00;
    if (local_40.file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_40.file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    return (__uniq_ptr_data<mjs::statement,_std::default_delete<mjs::statement>,_true,_true>)
           (__uniq_ptr_data<mjs::statement,_std::default_delete<mjs::statement>,_true,_true>)this;
  }
  __assert_fail("statement_pos_",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.cpp",
                0x147,
                "statement_ptr mjs::parser::make_statement(Args &&...) [T = mjs::block_statement, Args = <std::vector<std::unique_ptr<mjs::statement>>, bool &>]"
               );
}

Assistant:

statement_ptr make_statement(Args&&... args) {
        assert(statement_pos_);
        auto s = statement_ptr{new T{statement_pos_->extend(), std::forward<Args>(args)...}};
#ifdef PARSER_DEBUG
        std::wcout << s->extend() << " Producting: " << *s << "\n";
#endif
        return s;
    }